

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O2

Vec_Int_t * Dtc_ManFindCommonCuts(Gia_Man_t *p,Vec_Int_t *vCutsXor,Vec_Int_t *vCutsMaj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  long lVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  
  piVar5 = vCutsXor->pArray;
  piVar6 = vCutsMaj->pArray;
  iVar2 = vCutsXor->nSize;
  iVar3 = vCutsMaj->nSize;
  p_00 = Vec_IntAlloc(1000);
  if ((vCutsXor->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vCutsXor) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                  ,0xf5,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((vCutsMaj->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vCutsMaj) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                  ,0xf6,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  piVar1 = piVar5 + iVar2;
  piVar7 = piVar6 + iVar3;
LAB_00569ed5:
  do {
    if ((piVar1 <= piVar5) || (piVar7 <= piVar6)) {
      if (p_00->nSize % 5 == 0) {
        return p_00;
      }
      __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                    ,0x109,"Vec_Int_t *Dtc_ManFindCommonCuts(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      if (piVar5[lVar4] != piVar6[lVar4]) {
        if (piVar5[lVar4] < piVar6[lVar4]) {
          piVar5 = piVar5 + 4;
        }
        else {
          piVar6 = piVar6 + (ulong)(piVar6[lVar4] < piVar5[lVar4]) * 4;
        }
        goto LAB_00569ed5;
      }
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      Vec_IntPush(p_00,piVar5[lVar4]);
    }
    Vec_IntPush(p_00,piVar6[3]);
    piVar5 = piVar5 + 4;
    piVar6 = piVar6 + 4;
  } while( true );
}

Assistant:

Vec_Int_t * Dtc_ManFindCommonCuts( Gia_Man_t * p, Vec_Int_t * vCutsXor, Vec_Int_t * vCutsMaj )
{
    int * pCuts0 = Vec_IntArray(vCutsXor);
    int * pCuts1 = Vec_IntArray(vCutsMaj);
    int * pLimit0 = Vec_IntLimit(vCutsXor);
    int * pLimit1 = Vec_IntLimit(vCutsMaj);   int i;
    Vec_Int_t * vFadds = Vec_IntAlloc( 1000 );
    assert( Vec_IntSize(vCutsXor) % 4 == 0 );
    assert( Vec_IntSize(vCutsMaj) % 4 == 0 );
    while ( pCuts0 < pLimit0 && pCuts1 < pLimit1 )
    {
        for ( i = 0; i < 3; i++ )
            if ( pCuts0[i] != pCuts1[i] )
                break;
        if ( i == 3 )
        {
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vFadds, pCuts0[i] );
            Vec_IntPush( vFadds, pCuts1[3] );
            pCuts0 += 4;
            pCuts1 += 4;
        }
        else if ( pCuts0[i] < pCuts1[i] )
            pCuts0 += 4;
        else if ( pCuts0[i] > pCuts1[i] )
            pCuts1 += 4;
    }
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    return vFadds;
}